

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::BufferGLImpl::CreateViewInternal
          (BufferGLImpl *this,BufferViewDesc *OrigViewDesc,IBufferView **ppView,bool bIsDefaultView)

{
  bool bVar1;
  Char *pCVar2;
  GraphicsAdapterInfo *pGVar3;
  FixedBlockMemoryAllocator *Allocator;
  DeviceContextGLImpl *this_00;
  BufferViewGLImpl *pBVar4;
  BufferGLImpl *local_1a0;
  Char *ViewTypeName;
  runtime_error *anon_var_0;
  MakeNewRCObj<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator> local_128;
  GLContextState *local_100;
  GLContextState *CtxState;
  string msg_3;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pContext;
  string msg_2;
  FixedBlockMemoryAllocator *BuffViewAllocator;
  BufferViewDesc ViewDesc;
  RenderDeviceGLImpl *local_80;
  RenderDeviceGLImpl *pDeviceGLImpl;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  bool bIsDefaultView_local;
  IBufferView **ppView_local;
  BufferViewDesc *OrigViewDesc_local;
  BufferGLImpl *this_local;
  
  msg.field_2._M_local_buf[0xf] = bIsDefaultView;
  if (ppView == (IBufferView **)0x0) {
    FormatString<char[36]>((string *)local_48,(char (*) [36])"Buffer view pointer address is null");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,399);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    if (*ppView != (IBufferView *)0x0) {
      FormatString<char[64]>
                ((string *)&pDeviceGLImpl,
                 (char (*) [64])"Overwriting reference to existing object may cause memory leaks");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
                 ,0x191);
      std::__cxx11::string::~string((string *)&pDeviceGLImpl);
    }
    *ppView = (IBufferView *)0x0;
    local_80 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
               ::GetDevice((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                            *)this);
    BuffViewAllocator = (FixedBlockMemoryAllocator *)(OrigViewDesc->super_DeviceObjectAttribs).Name;
    ViewDesc.super_DeviceObjectAttribs.Name = *(Char **)&OrigViewDesc->ViewType;
    ViewDesc._8_8_ = OrigViewDesc->ByteOffset;
    ViewDesc.ByteOffset = OrigViewDesc->ByteWidth;
    pGVar3 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetAdapterInfo
                       (&local_80->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
    ValidateAndCorrectBufferViewDesc
              (&(this->super_BufferBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                .m_Desc,(BufferViewDesc *)&BuffViewAllocator,
               (pGVar3->Buffer).StructuredBufferOffsetAlignment);
    Allocator = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetBuffViewObjAllocator
                          (&local_80->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
    if (Allocator != (this->super_BufferBase<Diligent::EngineGLImplTraits>).m_dbgBuffViewAllocator)
    {
      FormatString<char[79]>
                ((string *)&pContext,
                 (char (*) [79])
                 "Buff view allocator does not match allocator provided at buffer initialization");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
                 ,0x19d);
      std::__cxx11::string::~string((string *)&pContext);
    }
    RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
              ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)((long)&msg_3.field_2 + 8),
               (size_t)local_80);
    bVar1 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator!
                      ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg_3.field_2 + 8));
    if (bVar1) {
      FormatString<char[36]>
                ((string *)&CtxState,(char (*) [36])"Immediate context has been released");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
                 ,0x1a0);
      std::__cxx11::string::~string((string *)&CtxState);
    }
    this_00 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator->
                        ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg_3.field_2 + 8))
    ;
    local_100 = DeviceContextGLImpl::GetContextState(this_00);
    local_1a0 = this;
    if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
      local_1a0 = (BufferGLImpl *)0x0;
    }
    MakeNewRCObj<Diligent::BufferViewGLImpl,_Diligent::FixedBlockMemoryAllocator>::MakeNewRCObj
              (&local_128,Allocator,"BufferViewGLImpl instance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x1a3,(IObject *)local_1a0);
    anon_var_0 = (runtime_error *)this;
    pBVar4 = MakeNewRCObj<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>::
             operator()((MakeNewRCObj<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>
                         *)&local_128,&local_80,local_100,(BufferViewDesc *)&BuffViewAllocator,
                        (BufferGLImpl **)&anon_var_0,(bool *)(msg.field_2._M_local_buf + 0xf));
    *ppView = (IBufferView *)pBVar4;
    if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
      (*((*ppView)->super_IDeviceObject).super_IObject._vptr_IObject[1])();
    }
    RefCntAutoPtr<Diligent::DeviceContextGLImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg_3.field_2 + 8));
  }
  return;
}

Assistant:

void BufferGLImpl::CreateViewInternal(const BufferViewDesc& OrigViewDesc, IBufferView** ppView, bool bIsDefaultView)
{
    VERIFY(ppView != nullptr, "Buffer view pointer address is null");
    if (!ppView) return;
    VERIFY(*ppView == nullptr, "Overwriting reference to existing object may cause memory leaks");

    *ppView = nullptr;

    try
    {
        auto* const pDeviceGLImpl = GetDevice();

        auto ViewDesc = OrigViewDesc;
        ValidateAndCorrectBufferViewDesc(m_Desc, ViewDesc, pDeviceGLImpl->GetAdapterInfo().Buffer.StructuredBufferOffsetAlignment);

        auto& BuffViewAllocator = pDeviceGLImpl->GetBuffViewObjAllocator();
        VERIFY(&BuffViewAllocator == &m_dbgBuffViewAllocator, "Buff view allocator does not match allocator provided at buffer initialization");

        auto pContext = pDeviceGLImpl->GetImmediateContext(0);
        VERIFY(pContext, "Immediate context has been released");
        auto& CtxState = pContext->GetContextState();

        *ppView = NEW_RC_OBJ(BuffViewAllocator, "BufferViewGLImpl instance", BufferViewGLImpl, bIsDefaultView ? this : nullptr)(pDeviceGLImpl, CtxState, ViewDesc, this, bIsDefaultView);

        if (!bIsDefaultView)
            (*ppView)->AddRef();
    }
    catch (const std::runtime_error&)
    {
        const auto* ViewTypeName = GetBufferViewTypeLiteralName(OrigViewDesc.ViewType);
        LOG_ERROR("Failed to create view '", (OrigViewDesc.Name ? OrigViewDesc.Name : ""), "' (", ViewTypeName, ") for buffer '", (m_Desc.Name ? m_Desc.Name : ""), "'");
    }
}